

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void tricore_tr_translate_insn(DisasContextBase_conflict1 *dcbase,CPUState_conflict *cpu)

{
  abi_ptr_conflict addr;
  long lVar1;
  TCGContext_conflict9 *pTVar2;
  CPUArchState_conflict30 *env;
  long lVar3;
  TCGCond TVar4;
  _Bool _Var5;
  DisasJumpType DVar6;
  int iVar7;
  uint uVar8;
  uint32_t uVar9;
  uintptr_t o_3;
  undefined1 *puVar10;
  TCGv_i32 pTVar11;
  TCGv_i64 pTVar12;
  TCGv_i64 pTVar13;
  TCGv_i32 pTVar14;
  TCGv_i32 pTVar15;
  char cVar16;
  ushort con;
  uint uVar17;
  int32_t iVar18;
  TCGv_i32 pTVar19;
  byte bVar21;
  uint uVar20;
  uintptr_t o_6;
  long *plVar22;
  ulong uVar23;
  uintptr_t o_1;
  TCGTemp *ts;
  DisasJumpType opc;
  MemOp MVar24;
  int32_t low;
  uintptr_t o;
  TCGTemp *ts_00;
  uintptr_t o_2;
  TCGTemp *ts_01;
  TCGTemp *local_78;
  TCGTemp *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  lVar1 = *(long *)&dcbase[2].pc_first;
  pTVar2 = *(TCGContext_conflict9 **)(lVar1 + 0x2e8);
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  local_58 = (TCGTemp *)(ulong)dcbase->pc_next;
  if (*(int *)(lVar1 + 0x57c) == 0) {
    if (*(TCGTemp **)(lVar1 + 0x578 + (long)*(int *)(lVar1 + 0x39e0) * 8) == local_58)
    goto LAB_00b3b432;
  }
  else {
    puVar10 = (undefined1 *)g_tree_lookup(*(GTree **)(lVar1 + 0x780),&local_58);
    if (puVar10 == &DAT_00000001) {
LAB_00b3b432:
      dcbase->is_jmp = DISAS_TARGET_6;
      return;
    }
  }
  DVar6 = cpu_lduw_code_tricore(env,dcbase->pc_next);
  uVar23 = (ulong)DVar6;
  uVar8 = dcbase->pc_next;
  _Var5 = _hook_exists_bounded(*(list_item **)(*(long *)&dcbase[2].pc_first + 0x358),(ulong)uVar8);
  if (_Var5) {
    gen_save_pc((DisasContext_conflict14 *)dcbase,uVar8);
    lVar1 = *(long *)&dcbase[2].pc_first;
    uVar8 = dcbase->pc_next;
    pTVar11 = tcg_const_i32_tricore(pTVar2,(DVar6 & DISAS_TOO_MANY) * 2 + 2);
    pTVar12 = tcg_const_i64_tricore(pTVar2,lVar1);
    pTVar13 = tcg_const_i64_tricore(pTVar2,(ulong)uVar8);
    ts_00 = (TCGTemp *)(pTVar12 + (long)pTVar2);
    ts = (TCGTemp *)(pTVar13 + (long)pTVar2);
    ts_01 = (TCGTemp *)(pTVar11 + (long)pTVar2);
    local_60 = (TCGTemp *)0x0;
    local_78 = ts_00;
    local_70 = ts;
    local_68 = ts_01;
    if (*(int *)(lVar1 + 0x4f8) == 1) {
      plVar22 = (long *)(lVar1 + 0x358);
      while (plVar22 = (long *)*plVar22, plVar22 != (long *)0x0) {
        lVar3 = plVar22[1];
        if (*(char *)(lVar3 + 0x14) == '\0') {
          pTVar12 = tcg_const_i64_tricore(pTVar2,*(int64_t *)(lVar3 + 0x30));
          local_60 = (TCGTemp *)(pTVar12 + (long)pTVar2);
          (**(code **)(lVar1 + 0x178))(lVar1,lVar3,&local_78,4);
          tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar12 + (long)pTVar2));
        }
      }
    }
    else {
      pTVar11 = tcg_const_i32_tricore(pTVar2,2);
      local_58 = ts_01;
      local_50 = (TCGTemp *)(pTVar11 + (long)pTVar2);
      local_48 = ts_00;
      local_40 = ts;
      tcg_gen_callN_tricore(pTVar2,helper_uc_tracecode,(TCGTemp *)0x0,4,&local_58);
      tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
    }
    tcg_temp_free_internal_tricore(pTVar2,ts);
    tcg_temp_free_internal_tricore(pTVar2,ts_00);
    tcg_temp_free_internal_tricore(pTVar2,ts_01);
    check_exit_request_tricore(pTVar2);
  }
  if ((DVar6 & DISAS_TOO_MANY) != DISAS_NEXT) {
    uVar9 = cpu_lduw_code_tricore(env,dcbase->pc_next + 2);
    dcbase[1].is_jmp = uVar9 << 0x10 | DVar6 & 0xffff;
    dcbase[1].pc_next = dcbase->pc_next + 4;
    decode_32Bit_opc((DisasContext_conflict14 *)dcbase);
    goto switchD_00b3ba87_caseD_0;
  }
  dcbase[1].is_jmp = DVar6 & 0xffff;
  dcbase[1].pc_next = dcbase->pc_next + 2;
  pTVar2 = *(TCGContext_conflict9 **)(*(long *)&dcbase[2].pc_first + 0x2e8);
  if ((DVar6 & 0x3e) == 0x10) {
switchD_00b3b520_caseD_10:
    pTVar11 = tcg_temp_new_i32(pTVar2);
    tcg_gen_shli_i32_tricore(pTVar2,pTVar11,pTVar2->cpu_gpr_d[0xf],DVar6 >> 6 & 3);
    tcg_gen_add_i32(pTVar2,*(TCGv_i32 *)((long)pTVar2->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78)),
                    *(TCGv_i32 *)((long)pTVar2->cpu_gpr_a + (ulong)(DVar6 >> 9 & 0x78)),pTVar11);
LAB_00b3c061:
    tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
    goto switchD_00b3ba87_caseD_0;
  }
  cVar16 = (char)DVar6;
  if (cVar16 == -1) goto switchD_00b3b520_caseD_1;
  opc = DVar6 & 0xfe;
  iVar7 = (int)(uVar23 & 0xff);
  bVar21 = (byte)(DVar6 >> 8);
  uVar8 = DVar6 >> 8;
  switch(uVar23 & 0xff) {
  case 0:
    switch((uVar23 & 0xffff) >> 0xc) {
    case 0:
    case 10:
      break;
    default:
      goto switchD_00b3b520_caseD_1;
    case 7:
      gen_fret((DisasContext_conflict14 *)dcbase);
      break;
    case 8:
      gen_helper_rfe(pTVar2,pTVar2->cpu_env);
      tcg_gen_exit_tb_tricore(pTVar2,(TranslationBlock *)0x0,0);
      dcbase->is_jmp = DISAS_NORETURN;
      break;
    case 9:
      opc = DISAS_TARGET_6;
      uVar20 = 0;
      goto LAB_00b3bb71;
    }
    goto switchD_00b3ba87_caseD_0;
  default:
    goto switchD_00b3b520_caseD_1;
  case 2:
  case 0x12:
  case 0x1a:
  case 0x22:
  case 0x26:
  case 0x2a:
  case 0x30:
  case 0x3a:
  case 0x40:
  case 0x42:
  case 0x52:
  case 0x5a:
  case 0x60:
  case 0x62:
  case 0x6a:
  case 0x7a:
  case 0x80:
  case 0xa2:
  case 0xa6:
  case 0xc6:
  case 0xe2:
    uVar8 = uVar8 & 0xf;
    uVar20 = DVar6 >> 0xc & 0xf;
    if (cVar16 == '\x02') {
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
LAB_00b3bd44:
      pTVar19 = pTVar2->cpu_gpr_d[uVar20];
LAB_00b3bd65:
      tcg_gen_mov_i32(pTVar2,pTVar11,pTVar19);
      goto switchD_00b3ba87_caseD_0;
    }
    if (iVar7 == 0x12) {
      pTVar19 = pTVar2->cpu_gpr_d[uVar8];
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
LAB_00b3be23:
      pTVar14 = pTVar2->cpu_gpr_d[uVar20];
    }
    else {
      if (iVar7 == 0x1a) {
        pTVar19 = pTVar2->cpu_gpr_d[0xf];
        pTVar11 = pTVar2->cpu_gpr_d[uVar8];
        goto LAB_00b3be23;
      }
      if (iVar7 == 0x22) {
        gen_adds((DisasContext_conflict14 *)dcbase,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8]
                 ,pTVar2->cpu_gpr_d[uVar20]);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x26) {
        tcg_gen_and_i32(pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8],
                        pTVar2->cpu_gpr_d[uVar20]);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x2a) {
        pTVar11 = tcg_const_i32_tricore(pTVar2,0);
        pTVar19 = pTVar2->cpu_gpr_d[uVar8];
        pTVar14 = pTVar2->cpu_gpr_d[0xf];
        pTVar15 = pTVar2->cpu_gpr_d[uVar20];
        TVar4 = TCG_COND_NE;
LAB_00b3bcdf:
        tcg_gen_movcond_i32_tricore(pTVar2,TVar4,pTVar19,pTVar14,pTVar11,pTVar15,pTVar19);
        goto LAB_00b3c061;
      }
      if (iVar7 == 0x30) {
        tcg_gen_add_i32(pTVar2,pTVar2->cpu_gpr_a[uVar8],pTVar2->cpu_gpr_a[uVar8],
                        pTVar2->cpu_gpr_a[uVar20]);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x3a) {
        pTVar11 = pTVar2->cpu_gpr_d[0xf];
        pTVar19 = pTVar2->cpu_gpr_d[uVar8];
        pTVar14 = pTVar2->cpu_gpr_d[uVar20];
        TVar4 = TCG_COND_EQ;
LAB_00b3bd90:
        tcg_gen_setcond_i32_tricore(pTVar2,TVar4,pTVar11,pTVar19,pTVar14);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x40) {
        pTVar11 = pTVar2->cpu_gpr_a[uVar8];
LAB_00b3bd5b:
        pTVar19 = pTVar2->cpu_gpr_a[uVar20];
        goto LAB_00b3bd65;
      }
      if (iVar7 == 0xe2) {
        gen_mul_i32s((DisasContext_conflict14 *)dcbase,pTVar2->cpu_gpr_d[uVar8],
                     pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar20]);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x52) {
        pTVar19 = pTVar2->cpu_gpr_d[uVar8];
        pTVar11 = pTVar2->cpu_gpr_d[0xf];
LAB_00b3bdd5:
        pTVar14 = pTVar2->cpu_gpr_d[uVar20];
LAB_00b3bde2:
        gen_sub_d((DisasContext_conflict14 *)dcbase,pTVar19,pTVar11,pTVar14);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x5a) {
        pTVar19 = pTVar2->cpu_gpr_d[0xf];
        pTVar11 = pTVar2->cpu_gpr_d[uVar8];
        goto LAB_00b3bdd5;
      }
      if (iVar7 == 0x60) {
        pTVar11 = pTVar2->cpu_gpr_a[uVar8];
        goto LAB_00b3bd44;
      }
      if (iVar7 == 0x62) {
        gen_subs((DisasContext_conflict14 *)dcbase,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8]
                 ,pTVar2->cpu_gpr_d[uVar20]);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x6a) {
        pTVar11 = tcg_const_i32_tricore(pTVar2,0);
        pTVar19 = pTVar2->cpu_gpr_d[uVar8];
        pTVar14 = pTVar2->cpu_gpr_d[0xf];
        pTVar15 = pTVar2->cpu_gpr_d[uVar20];
        TVar4 = TCG_COND_EQ;
        goto LAB_00b3bcdf;
      }
      if (iVar7 == 0x7a) {
        pTVar11 = pTVar2->cpu_gpr_d[0xf];
        pTVar19 = pTVar2->cpu_gpr_d[uVar8];
        pTVar14 = pTVar2->cpu_gpr_d[uVar20];
        TVar4 = TCG_COND_LT;
        goto LAB_00b3bd90;
      }
      if (iVar7 == 0x80) {
        pTVar11 = pTVar2->cpu_gpr_d[uVar8];
        goto LAB_00b3bd5b;
      }
      if (iVar7 == 0xa2) {
        pTVar11 = pTVar2->cpu_gpr_d[uVar8];
        pTVar14 = pTVar2->cpu_gpr_d[uVar20];
        pTVar19 = pTVar11;
        goto LAB_00b3bde2;
      }
      if (iVar7 == 0xa6) {
        tcg_gen_or_i32(pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8],
                       pTVar2->cpu_gpr_d[uVar20]);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0xc6) {
        tcg_gen_xor_i32(pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8],
                        pTVar2->cpu_gpr_d[uVar20]);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 != 0x42) goto switchD_00b3b520_caseD_1;
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      pTVar14 = pTVar2->cpu_gpr_d[uVar20];
      pTVar19 = pTVar11;
    }
    gen_add_d((DisasContext_conflict14 *)dcbase,pTVar19,pTVar11,pTVar14);
    goto switchD_00b3ba87_caseD_0;
  case 4:
  case 0x14:
  case 0x44:
  case 0x54:
  case 0x84:
  case 0x94:
  case 0xc4:
  case 0xd4:
    uVar20 = (opc - DISAS_TARGET_1) * 0x10000000 | opc - DISAS_TARGET_1 >> 4;
    if (0xd < uVar20) goto switchD_00b3b520_caseD_1;
    uVar8 = uVar8 & 0xf;
    uVar17 = DVar6 >> 0xc & 0xf;
    switch(uVar20) {
    case 0:
      uVar23 = (ulong)uVar17;
      tcg_gen_qemu_ld_i32_tricore
                (pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns
                 ,MO_8);
LAB_00b3b8d5:
      pTVar11 = pTVar2->cpu_gpr_a[uVar23];
      iVar18 = 1;
      break;
    case 1:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      pTVar19 = pTVar2->cpu_gpr_a[uVar17];
      iVar7 = dcbase[1].num_insns;
      MVar24 = MO_8;
      goto LAB_00b3c23f;
    default:
      goto switchD_00b3b520_caseD_1;
    case 4:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      goto LAB_00b3c1be;
    case 5:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      goto LAB_00b3c22a;
    case 8:
      uVar23 = (ulong)uVar17;
      tcg_gen_qemu_ld_i32_tricore
                (pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns
                 ,MO_LESW);
LAB_00b3c34c:
      pTVar11 = pTVar2->cpu_gpr_a[uVar23];
      iVar18 = 2;
      break;
    case 9:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      pTVar19 = pTVar2->cpu_gpr_a[uVar17];
      iVar7 = dcbase[1].num_insns;
      MVar24 = MO_LESW;
      goto LAB_00b3c23f;
    case 0xc:
      pTVar11 = pTVar2->cpu_gpr_a[uVar8];
LAB_00b3c1be:
      uVar23 = (ulong)uVar17;
      tcg_gen_qemu_ld_i32_tricore
                (pTVar2,pTVar11,pTVar2->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns,MO_LESL);
LAB_00b3c2f3:
      pTVar11 = pTVar2->cpu_gpr_a[uVar23];
      iVar18 = 4;
      break;
    case 0xd:
      pTVar11 = pTVar2->cpu_gpr_a[uVar8];
LAB_00b3c22a:
      pTVar19 = pTVar2->cpu_gpr_a[uVar17];
      iVar7 = dcbase[1].num_insns;
      MVar24 = MO_LESL;
LAB_00b3c23f:
      tcg_gen_qemu_ld_i32_tricore(pTVar2,pTVar11,pTVar19,(long)iVar7,MVar24);
      goto switchD_00b3ba87_caseD_0;
    }
    tcg_gen_addi_i32_tricore(pTVar2,pTVar11,pTVar11,iVar18);
    goto switchD_00b3ba87_caseD_0;
  case 6:
  case 0x82:
  case 0x86:
  case 0x8a:
  case 0x92:
  case 0x9a:
  case 0xa0:
  case 0xaa:
  case 0xb0:
  case 0xba:
  case 0xc2:
  case 0xca:
  case 0xd2:
  case 0xea:
  case 0xfa:
    uVar8 = uVar8 & 0xf;
    uVar20 = (int)(short)DVar6 >> 0xc;
    if (cVar16 == '\x06') {
      gen_shi((DisasContext_conflict14 *)dcbase,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8],
              uVar20);
      goto switchD_00b3ba87_caseD_0;
    }
    if (iVar7 == 0x82) {
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
LAB_00b3beb6:
      tcg_gen_movi_i32(pTVar2,pTVar11,uVar20);
    }
    else {
      if (iVar7 == 0x86) {
        gen_shaci((DisasContext_conflict14 *)dcbase,pTVar2->cpu_gpr_d[uVar8],
                  pTVar2->cpu_gpr_d[uVar8],uVar20);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x8a) {
        pTVar11 = pTVar2->cpu_gpr_d[uVar8];
        pTVar19 = pTVar2->cpu_gpr_d[0xf];
        TVar4 = TCG_COND_NE;
LAB_00b3be8d:
        gen_condi_add((DisasContext_conflict14 *)dcbase,TVar4,pTVar11,uVar20,pTVar11,pTVar19);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 == 0x92) {
        pTVar19 = pTVar2->cpu_gpr_d[uVar8];
        pTVar11 = pTVar2->cpu_gpr_d[0xf];
      }
      else {
        if (iVar7 != 0x9a) {
          if (iVar7 != 0xa0) {
            if (iVar7 == 0xaa) {
              pTVar14 = tcg_const_i32_tricore(pTVar2,0);
              pTVar15 = tcg_const_i32_tricore(pTVar2,uVar20);
              pTVar11 = pTVar2->cpu_gpr_d[uVar8];
              pTVar19 = pTVar2->cpu_gpr_d[0xf];
              TVar4 = TCG_COND_NE;
LAB_00b3bff4:
              tcg_gen_movcond_i32_tricore(pTVar2,TVar4,pTVar11,pTVar19,pTVar14,pTVar15,pTVar11);
              tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar14 + (long)pTVar2));
              tcg_temp_free_internal_tricore(pTVar2,(TCGTemp *)(pTVar15 + (long)pTVar2));
            }
            else {
              if (iVar7 == 0xb0) {
                tcg_gen_addi_i32_tricore
                          (pTVar2,pTVar2->cpu_gpr_a[uVar8],pTVar2->cpu_gpr_a[uVar8],uVar20);
                goto switchD_00b3ba87_caseD_0;
              }
              if (iVar7 == 0xba) {
                pTVar11 = pTVar2->cpu_gpr_d[0xf];
                pTVar19 = pTVar2->cpu_gpr_d[uVar8];
                TVar4 = TCG_COND_EQ;
              }
              else {
                if (iVar7 != 0xfa) {
                  if (iVar7 == 0xca) {
                    pTVar11 = pTVar2->cpu_gpr_d[uVar8];
                    pTVar19 = pTVar2->cpu_gpr_d[0xf];
                    TVar4 = TCG_COND_EQ;
                    goto LAB_00b3be8d;
                  }
                  if (iVar7 == 0xd2) {
                    if (((ulong)dcbase[2].tb & 4) != 0) {
                      tcg_gen_movi_i32(pTVar2,pTVar2->cpu_gpr_d[uVar8],uVar20);
                      tcg_gen_sari_i32_tricore
                                (pTVar2,pTVar2->cpu_gpr_d[(ulong)uVar8 + 1],pTVar2->cpu_gpr_d[uVar8]
                                 ,0x1f);
                      goto switchD_00b3ba87_caseD_0;
                    }
                  }
                  else {
                    if (iVar7 == 0xea) {
                      pTVar14 = tcg_const_i32_tricore(pTVar2,0);
                      pTVar15 = tcg_const_i32_tricore(pTVar2,uVar20);
                      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
                      pTVar19 = pTVar2->cpu_gpr_d[0xf];
                      TVar4 = TCG_COND_EQ;
                      goto LAB_00b3bff4;
                    }
                    if (iVar7 == 0xc2) {
                      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
                      pTVar19 = pTVar11;
                      goto LAB_00b3bfb9;
                    }
                  }
                  generate_trap((DisasContext_conflict14 *)dcbase,2,1);
                  goto switchD_00b3ba87_caseD_0;
                }
                pTVar11 = pTVar2->cpu_gpr_d[0xf];
                pTVar19 = pTVar2->cpu_gpr_d[uVar8];
                TVar4 = TCG_COND_LT;
              }
              tcg_gen_setcondi_i32_tricore(pTVar2,TVar4,pTVar11,pTVar19,uVar20);
            }
            goto switchD_00b3ba87_caseD_0;
          }
          uVar20 = DVar6 >> 0xc & 0xf;
          pTVar11 = pTVar2->cpu_gpr_a[uVar8];
          goto LAB_00b3beb6;
        }
        pTVar19 = pTVar2->cpu_gpr_d[0xf];
        pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      }
LAB_00b3bfb9:
      gen_addi_d((DisasContext_conflict14 *)dcbase,pTVar19,pTVar11,uVar20);
    }
    goto switchD_00b3ba87_caseD_0;
  case 8:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
    pTVar19 = pTVar2->cpu_gpr_a[0xf];
    con = (ushort)((DVar6 & 0xffff) >> 0xc);
LAB_00b3ba4c:
    MVar24 = MO_8;
    goto LAB_00b3c264;
  case 0xc:
  case 0x2c:
  case 0x4c:
  case 0x6c:
  case 0x8c:
  case 0xac:
  case 0xcc:
  case 0xec:
    uVar8 = (opc - DISAS_TARGET_9) * 0x8000000 | opc - DISAS_TARGET_9 >> 5;
    if (7 < uVar8) goto switchD_00b3b520_caseD_1;
    uVar20 = DVar6 >> 0xc & 0xf;
    uVar17 = DVar6 >> 8 & 0xf;
    con = (ushort)uVar17;
    switch(uVar8) {
    case 0:
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
      pTVar19 = pTVar2->cpu_gpr_a[uVar20];
      goto LAB_00b3ba4c;
    case 1:
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
      pTVar19 = pTVar2->cpu_gpr_a[uVar20];
      goto LAB_00b3c197;
    case 2:
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
      break;
    case 3:
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
      goto LAB_00b3c16f;
    case 4:
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
      pTVar19 = pTVar2->cpu_gpr_a[uVar20];
      goto LAB_00b3c10a;
    case 5:
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
      pTVar19 = pTVar2->cpu_gpr_a[uVar20];
      con = con * 2;
      goto LAB_00b3c20f;
    case 6:
      pTVar11 = pTVar2->cpu_gpr_a[0xf];
      break;
    case 7:
      pTVar11 = pTVar2->cpu_gpr_a[0xf];
LAB_00b3c16f:
      pTVar19 = pTVar2->cpu_gpr_a[uVar20];
      con = (ushort)(uVar17 << 2);
      goto LAB_00b3c17c;
    }
    pTVar19 = pTVar2->cpu_gpr_a[uVar20];
    con = (ushort)(uVar17 << 2);
    goto LAB_00b3c25d;
  case 0xe:
  case 0x3e:
  case 0x4e:
  case 0x76:
  case 0x7c:
  case 0x7e:
  case 0x8e:
  case 0xbc:
  case 0xce:
  case 0xf6:
  case 0xfc:
switchD_00b3b520_caseD_e:
    uVar20 = DVar6 >> 0xc & 0xf;
    uVar8 = DVar6 >> 8 & 0xf;
    uVar17 = 0;
    break;
  case 0x10:
    goto switchD_00b3b520_caseD_10;
  case 0x16:
  case 0x20:
  case 0x58:
  case 0x78:
  case 0x96:
  case 0xd8:
  case 0xda:
  case 0xe0:
  case 0xf8:
    uVar8 = (uint)bVar21;
    if (cVar16 == -8) {
      pTVar19 = pTVar2->cpu_gpr_a[10];
      pTVar11 = pTVar2->cpu_gpr_a[0xf];
LAB_00b3c090:
      con = (ushort)bVar21 << 2;
      MVar24 = MO_LESL;
      goto LAB_00b3c216;
    }
    if (iVar7 == 0x20) {
      tcg_gen_subi_i32_tricore(pTVar2,pTVar2->cpu_gpr_a[10],pTVar2->cpu_gpr_a[10],uVar8);
      goto switchD_00b3ba87_caseD_0;
    }
    if (iVar7 == 0x58) {
      pTVar19 = pTVar2->cpu_gpr_a[10];
      pTVar11 = pTVar2->cpu_gpr_d[0xf];
    }
    else {
      if (iVar7 == 0x78) {
        pTVar19 = pTVar2->cpu_gpr_a[10];
        pTVar11 = pTVar2->cpu_gpr_d[0xf];
        goto LAB_00b3c090;
      }
      if (iVar7 == 0x96) {
        tcg_gen_ori_i32_tricore(pTVar2,pTVar2->cpu_gpr_d[0xf],pTVar2->cpu_gpr_d[0xf],uVar8);
        goto switchD_00b3ba87_caseD_0;
      }
      if (iVar7 != 0xd8) {
        if (iVar7 == 0xda) {
          tcg_gen_movi_i32(pTVar2,pTVar2->cpu_gpr_d[0xf],uVar8);
          goto switchD_00b3ba87_caseD_0;
        }
        if (iVar7 == 0xe0) {
          pTVar11 = tcg_const_i32_tricore(pTVar2,uVar8);
          gen_helper_bisr(pTVar2,pTVar2->cpu_env,pTVar11);
          goto LAB_00b3c061;
        }
        if (iVar7 == 0x16) {
          tcg_gen_andi_i32_tricore(pTVar2,pTVar2->cpu_gpr_d[0xf],pTVar2->cpu_gpr_d[0xf],uVar8);
          goto switchD_00b3ba87_caseD_0;
        }
        goto switchD_00b3b520_caseD_1;
      }
      pTVar19 = pTVar2->cpu_gpr_a[10];
      pTVar11 = pTVar2->cpu_gpr_a[0xf];
    }
    con = (ushort)bVar21 << 2;
    MVar24 = MO_LESL;
    goto LAB_00b3c264;
  case 0x1e:
  case 0x5e:
switchD_00b3b520_caseD_1e:
    uVar8 = uVar8 & 0xf;
    uVar17 = (int)(short)DVar6 >> 0xc;
    uVar20 = 0;
    break;
  case 0x24:
  case 0x34:
  case 100:
  case 0x74:
  case 0xa4:
  case 0xb4:
  case 0xe4:
  case 0xf4:
    uVar20 = (opc - 0x24) * 0x10000000 | opc - 0x24 >> 4;
    if (0xd < uVar20) goto switchD_00b3b520_caseD_1;
    uVar8 = uVar8 & 0xf;
    uVar17 = DVar6 >> 0xc & 0xf;
    switch(uVar20) {
    case 0:
      uVar23 = (ulong)uVar17;
      tcg_gen_qemu_st_i32_tricore
                (pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns
                 ,MO_8);
      goto LAB_00b3b8d5;
    case 1:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      pTVar19 = pTVar2->cpu_gpr_a[uVar17];
      iVar7 = dcbase[1].num_insns;
      MVar24 = MO_8;
      break;
    default:
      goto switchD_00b3b520_caseD_1;
    case 4:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      goto LAB_00b3c2d9;
    case 5:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      goto LAB_00b3c309;
    case 8:
      uVar23 = (ulong)uVar17;
      tcg_gen_qemu_st_i32_tricore
                (pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns
                 ,MO_16);
      goto LAB_00b3c34c;
    case 9:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      pTVar19 = pTVar2->cpu_gpr_a[uVar17];
      iVar7 = dcbase[1].num_insns;
      MVar24 = MO_16;
      break;
    case 0xc:
      pTVar11 = pTVar2->cpu_gpr_a[uVar8];
LAB_00b3c2d9:
      uVar23 = (ulong)uVar17;
      tcg_gen_qemu_st_i32_tricore
                (pTVar2,pTVar11,pTVar2->cpu_gpr_a[uVar23],(long)dcbase[1].num_insns,MO_32);
      goto LAB_00b3c2f3;
    case 0xd:
      pTVar11 = pTVar2->cpu_gpr_a[uVar8];
LAB_00b3c309:
      pTVar19 = pTVar2->cpu_gpr_a[uVar17];
      iVar7 = dcbase[1].num_insns;
      MVar24 = MO_32;
    }
    tcg_gen_qemu_st_i32_tricore(pTVar2,pTVar11,pTVar19,(long)iVar7,MVar24);
    goto switchD_00b3ba87_caseD_0;
  case 0x28:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
    pTVar19 = pTVar2->cpu_gpr_a[0xf];
    con = (ushort)((DVar6 & 0xffff) >> 0xc);
LAB_00b3c197:
    MVar24 = MO_8;
    goto LAB_00b3c216;
  case 0x2e:
  case 0xae:
    uVar8 = uVar8 & 0xf;
    uVar17 = DVar6 >> 0xc & 0xf;
    uVar20 = 0;
    break;
  case 0x32:
    uVar23 = (uVar23 & 0xffff) >> 0xc;
    if (5 < (ushort)uVar23) goto switchD_00b3b520_caseD_1;
    uVar8 = DVar6 >> 8 & 0xf;
    switch(uVar23) {
    case 0:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      iVar18 = 0x7f;
      low = -0x80;
      break;
    case 1:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      iVar18 = 0xff;
      goto LAB_00b3c3ed;
    case 2:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      iVar18 = 0x7fff;
      low = -0x8000;
      break;
    case 3:
      pTVar11 = pTVar2->cpu_gpr_d[uVar8];
      iVar18 = 0xffff;
LAB_00b3c3ed:
      gen_saturate_u((DisasContext_conflict14 *)dcbase,pTVar11,pTVar11,iVar18);
      goto switchD_00b3ba87_caseD_0;
    case 4:
      goto switchD_00b3b520_caseD_1;
    case 5:
      pTVar11 = tcg_const_i32_tricore(pTVar2,-0x80000000);
      tcg_gen_setcond_i32_tricore
                (pTVar2,TCG_COND_EQ,pTVar2->cpu_PSW_V,pTVar2->cpu_gpr_d[uVar8],pTVar11);
      tcg_gen_shli_i32_tricore(pTVar2,pTVar2->cpu_PSW_V,pTVar2->cpu_PSW_V,0x1f);
      tcg_gen_or_i32(pTVar2,pTVar2->cpu_PSW_SV,pTVar2->cpu_PSW_SV,pTVar2->cpu_PSW_V);
      tcg_gen_neg_i32(pTVar2,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8]);
      tcg_gen_add_i32(pTVar2,pTVar2->cpu_PSW_AV,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_gpr_d[uVar8]);
      tcg_gen_xor_i32(pTVar2,pTVar2->cpu_PSW_AV,pTVar2->cpu_gpr_d[uVar8],pTVar2->cpu_PSW_AV);
      tcg_gen_or_i32(pTVar2,pTVar2->cpu_PSW_SAV,pTVar2->cpu_PSW_SAV,pTVar2->cpu_PSW_AV);
      goto LAB_00b3c061;
    }
    gen_saturate((DisasContext_conflict14 *)dcbase,pTVar11,pTVar11,iVar18,low);
    goto switchD_00b3ba87_caseD_0;
  case 0x3c:
  case 0x5c:
  case 0x6e:
  case 0xee:
    uVar8 = (uint)(char)bVar21;
    uVar20 = 0;
    uVar17 = 0;
    break;
  case 0x46:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
    tcg_gen_not_i32(pTVar2,pTVar11,pTVar11);
    goto switchD_00b3ba87_caseD_0;
  case 0x48:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
    goto LAB_00b3baa6;
  case 0x68:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
    goto LAB_00b3bb0c;
  case 0x88:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
    pTVar19 = pTVar2->cpu_gpr_a[0xf];
    con = (ushort)(DVar6 >> 0xb) & 0x1e;
LAB_00b3c10a:
    MVar24 = MO_LESW;
    goto LAB_00b3c264;
  case 0x9e:
  case 0xde:
    if (((ulong)dcbase[2].tb & 4) != 0) goto switchD_00b3b520_caseD_1e;
    goto switchD_00b3b520_caseD_1;
  case 0xa8:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_d + (ulong)(DVar6 >> 5 & 0x78));
    pTVar19 = pTVar2->cpu_gpr_a[0xf];
    con = (ushort)(DVar6 >> 0xb) & 0x1e;
LAB_00b3c20f:
    MVar24 = MO_LESW;
    goto LAB_00b3c216;
  case 0xbe:
  case 0xfe:
    if (((ulong)dcbase[2].tb & 4) != 0) goto switchD_00b3b520_caseD_e;
switchD_00b3b520_caseD_1:
    generate_trap((DisasContext_conflict14 *)dcbase,2,1);
    goto switchD_00b3ba87_caseD_0;
  case 200:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78));
LAB_00b3baa6:
    pTVar19 = pTVar2->cpu_gpr_a[0xf];
    con = (ushort)(DVar6 >> 10) & 0x3c;
LAB_00b3c25d:
    MVar24 = MO_LESL;
LAB_00b3c264:
    gen_offset_ld((DisasContext_conflict14 *)dcbase,pTVar11,pTVar19,con,MVar24);
    goto switchD_00b3ba87_caseD_0;
  case 0xdc:
    uVar20 = DVar6 >> 8 & 0xf;
    opc = 0xdc;
LAB_00b3bb71:
    uVar17 = 0;
    uVar8 = 0;
    break;
  case 0xe8:
    pTVar11 = *(TCGv_i32 *)((long)pTVar2->cpu_gpr_a + (ulong)(DVar6 >> 5 & 0x78));
LAB_00b3bb0c:
    pTVar19 = pTVar2->cpu_gpr_a[0xf];
    con = (ushort)(DVar6 >> 10) & 0x3c;
LAB_00b3c17c:
    MVar24 = MO_LESL;
LAB_00b3c216:
    gen_offset_st((DisasContext_conflict14 *)dcbase,pTVar11,pTVar19,con,MVar24);
    goto switchD_00b3ba87_caseD_0;
  }
  gen_compute_branch((DisasContext_conflict14 *)dcbase,opc,uVar20,0,uVar17,uVar8);
switchD_00b3ba87_caseD_0:
  addr = dcbase[1].pc_next;
  dcbase->pc_next = addr;
  if ((dcbase->is_jmp == DISAS_NEXT) &&
     ((uVar8 = addr - (dcbase->pc_first & 0xffffc000), 0x3fff < uVar8 ||
      ((0x3ffc < uVar8 && (uVar9 = cpu_lduw_code_tricore(env,addr), (uVar9 & 1) != 0)))))) {
    dcbase->is_jmp = DISAS_TOO_MANY;
  }
  return;
}

Assistant:

static void tricore_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CPUTriCoreState *env = cpu->env_ptr;
    uint16_t insn_lo;
    bool is_16bit;
    uint32_t insn_size;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        ctx->base.is_jmp = DISAS_UC_EXIT;
    } else {
        insn_lo = cpu_lduw_code(env, ctx->base.pc_next);
        is_16bit = tricore_insn_is_16bit(insn_lo);

        insn_size = is_16bit ? 2 : 4;
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(ctx->uc, UC_HOOK_CODE, ctx->base.pc_next)) {
            // Sync PC in advance
            gen_save_pc(ctx, ctx->base.pc_next);

            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, ctx->uc,
                             ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        if (is_16bit) {
            ctx->opcode = insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 2;
            decode_16Bit_opc(ctx);
        } else {
            uint32_t insn_hi = cpu_lduw_code(env, ctx->base.pc_next + 2);
            ctx->opcode = insn_hi << 16 | insn_lo;
            ctx->pc_succ_insn = ctx->base.pc_next + 4;
            decode_32Bit_opc(ctx);
        }
        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE
                || (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE - 3
                    && insn_crosses_page(env, ctx))) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}